

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void build_trap(m68k_info *info,int size,int immediate)

{
  build_absolute_jump_with_immediate
            (info,*(int *)((long)s_trap_lut + (ulong)(info->ir >> 6 & 0x3c)),size,immediate);
  return;
}

Assistant:

static void build_trap(m68k_info *info, int size, int immediate)
{
	build_absolute_jump_with_immediate(info, s_trap_lut[(info->ir >> 8) & 0xf], size, immediate);
}